

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

void duckdb::ParquetDecodeUtils::BitUnpackAlignedInternal<unsigned_long>
               (ByteBuffer *src,unsigned_long *dst,idx_t count,bitpacking_width_t width)

{
  data_ptr_t pdVar1;
  size_t size;
  idx_t next_read;
  ulong uVar2;
  ulong uVar3;
  unsigned_long aligned_data [32];
  uint32_t local_138 [66];
  
  pdVar1 = src->ptr;
  if (((ulong)pdVar1 & 7) == 0) {
    if (count != 0) {
      uVar3 = 0;
      uVar2 = 0;
      do {
        duckdb_fastpforlib::fastunpack((uint32_t *)(pdVar1 + (uVar3 >> 3)),dst,(uint)width);
        uVar2 = uVar2 + 0x20;
        uVar3 = uVar3 + (ulong)width * 0x20;
        dst = dst + 0x20;
      } while (uVar2 < count);
    }
    uVar3 = (width * count) / 8;
    src->len = src->len - uVar3;
    src->ptr = src->ptr + uVar3;
  }
  else if (count != 0) {
    uVar3 = 0;
    size = SUB168((ZEXT116(width) << 5) / ZEXT116(8),0);
    do {
      FastMemcpy(local_138,src->ptr,size);
      duckdb_fastpforlib::fastunpack(local_138,dst,(uint)width);
      src->len = src->len - size;
      src->ptr = src->ptr + size;
      dst = dst + 0x20;
      uVar3 = uVar3 + 0x20;
    } while (uVar3 < count);
  }
  return;
}

Assistant:

static void BitUnpackAlignedInternal(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		D_ASSERT(count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
		if (cast_pointer_to_uint64(src.ptr) % sizeof(T) == 0) {
			// Fast path: aligned
			BitpackingPrimitives::UnPackBuffer<T>(data_ptr_cast(dst), src.ptr, count, width);
			src.unsafe_inc(count * width / BITPACK_DLEN);
			return;
		}

		for (idx_t i = 0; i < count; i += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			const auto next_read = BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE * width / BITPACK_DLEN;

			// Buffer for alignment
			T aligned_data[BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE];

			// Copy over to aligned buffer
			FastMemcpy(aligned_data, src.ptr, next_read);

			// Unpack
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(dst), data_ptr_cast(aligned_data), width, true);

			src.unsafe_inc(next_read);
			dst += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}